

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
kj::ArrayBuilder<kj::(anonymous_namespace)::TestNoexceptObject>::~ArrayBuilder
          (ArrayBuilder<kj::(anonymous_namespace)::TestNoexceptObject> *this)

{
  TestNoexceptObject *pTVar1;
  RemoveConst<kj::(anonymous_namespace)::TestNoexceptObject> *pRVar2;
  TestNoexceptObject *pTVar3;
  
  pTVar1 = this->ptr;
  if (pTVar1 != (TestNoexceptObject *)0x0) {
    pRVar2 = this->pos;
    pTVar3 = this->endPtr;
    this->ptr = (TestNoexceptObject *)0x0;
    this->pos = (RemoveConst<kj::(anonymous_namespace)::TestNoexceptObject> *)0x0;
    this->endPtr = (TestNoexceptObject *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pTVar1,4,(long)pRVar2 - (long)pTVar1 >> 2,
               (long)pTVar3 - (long)pTVar1 >> 2,
               ArrayDisposer::Dispose_<kj::(anonymous_namespace)::TestNoexceptObject>::destruct);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }